

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O0

_Bool lrtr_ip_str_cmp(lrtr_ip_addr *addr1,char *addr2)

{
  lrtr_ip_addr a;
  lrtr_ip_addr b;
  int iVar1;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff94;
  char *addr2_local;
  lrtr_ip_addr *addr1_local;
  undefined1 local_28 [8];
  lrtr_ip_addr tmp;
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = lrtr_ip_str_to_addr(addr2,(lrtr_ip_addr *)local_28);
  if (iVar1 == -1) {
    addr1_local._7_1_ = false;
  }
  else {
    a.u.addr6.addr[2] = in_stack_ffffffffffffff7c;
    a._0_12_ = *(undefined1 (*) [12])((long)&addr1->u + 4);
    a.u.addr6.addr[3] = local_28._0_4_;
    b.u.addr6.addr[1] = tmp.u.addr6.addr[1];
    b._0_8_ = tmp._0_8_;
    b.u._8_8_ = in_stack_ffffffffffffff94;
    addr1_local._7_1_ = lrtr_ip_addr_equal(a,b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return addr1_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT bool lrtr_ip_str_cmp(const struct lrtr_ip_addr *addr1, const char *addr2)
{
	struct lrtr_ip_addr tmp;

	if (lrtr_ip_str_to_addr(addr2, &tmp) == -1)
		return false;
	return lrtr_ip_addr_equal(*addr1, tmp);
}